

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.cc
# Opt level: O0

void __thiscall
S2ShapeIndexBufferedRegion::GetCellUnionBound
          (S2ShapeIndexBufferedRegion *this,vector<S2CellId,_std::allocator<S2CellId>_> *cellids)

{
  bool bVar1;
  S2ShapeIndex *index;
  reference pSVar2;
  int *piVar3;
  int __c;
  int local_fc;
  S2Cap local_f8;
  S2CellId local_d0;
  S2CellId id;
  iterator __end1;
  iterator __begin1;
  vector<S2CellId,_std::allocator<S2CellId>_> *__range1;
  S2Cap local_a8;
  int local_7c;
  S1Angle SStack_78;
  int max_level;
  double local_70;
  double radians;
  S2ShapeIndexRegion<S2ShapeIndex> local_58;
  undefined1 local_30 [8];
  vector<S2CellId,_std::allocator<S2CellId>_> orig_cellids;
  vector<S2CellId,_std::allocator<S2CellId>_> *cellids_local;
  S2ShapeIndexBufferedRegion *this_local;
  
  orig_cellids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)cellids;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
  index = (S2ShapeIndex *)S2ShapeIndexBufferedRegion::index(this,(char *)cellids,__c);
  MakeS2ShapeIndexRegion<S2ShapeIndex>(&local_58,index);
  S2ShapeIndexRegion<S2ShapeIndex>::GetCellUnionBound
            (&local_58,(vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
  S2ShapeIndexRegion<S2ShapeIndex>::~S2ShapeIndexRegion(&local_58);
  SStack_78 = S1ChordAngle::ToAngle(&this->radius_);
  local_70 = S1Angle::radians(&stack0xffffffffffffff88);
  local_7c = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,local_70);
  local_7c = local_7c + -1;
  if (local_7c < 0) {
    S2Cap::Full();
    S2Cap::GetCellUnionBound
              (&local_a8,
               (vector<S2CellId,_std::allocator<S2CellId>_> *)
               orig_cellids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    S2Cap::~S2Cap(&local_a8);
  }
  else {
    std::vector<S2CellId,_std::allocator<S2CellId>_>::clear
              ((vector<S2CellId,_std::allocator<S2CellId>_> *)
               orig_cellids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    __end1 = std::vector<S2CellId,_std::allocator<S2CellId>_>::begin
                       ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
    id.id_ = (uint64)std::vector<S2CellId,_std::allocator<S2CellId>_>::end
                               ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                       *)&id), bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
               operator*(&__end1);
      local_d0.id_ = pSVar2->id_;
      bVar1 = S2CellId::is_face(&local_d0);
      if (bVar1) {
        S2Cap::Full();
        S2Cap::GetCellUnionBound
                  (&local_f8,
                   (vector<S2CellId,_std::allocator<S2CellId>_> *)
                   orig_cellids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        S2Cap::~S2Cap(&local_f8);
        break;
      }
      local_fc = S2CellId::level(&local_d0);
      local_fc = local_fc + -1;
      piVar3 = std::min<int>(&local_7c,&local_fc);
      S2CellId::AppendVertexNeighbors
                (&local_d0,*piVar3,
                 (vector<S2CellId,_std::allocator<S2CellId>_> *)
                 orig_cellids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::__normal_iterator<S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
      operator++(&__end1);
    }
  }
  std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_30);
  return;
}

Assistant:

void S2ShapeIndexBufferedRegion::GetCellUnionBound(vector<S2CellId> *cellids)
    const {
  // We start with a covering of the original S2ShapeIndex, and then expand it
  // by replacing each cell with a block of 4 cells whose union contains the
  // original cell buffered by the given radius.
  //
  // This increases the number of cells in the covering by a factor of 4 and
  // increases the covered area by a factor of 16, so it is not a very good
  // covering, but it is much better than always returning the 6 face cells.
  vector<S2CellId> orig_cellids;
  MakeS2ShapeIndexRegion(&index()).GetCellUnionBound(&orig_cellids);

  double radians = radius_.ToAngle().radians();
  int max_level = S2::kMinWidth.GetLevelForMinValue(radians) - 1;
  if (max_level < 0) {
    return S2Cap::Full().GetCellUnionBound(cellids);
  }
  cellids->clear();
  for (S2CellId id : orig_cellids) {
    if (id.is_face()) {
      return S2Cap::Full().GetCellUnionBound(cellids);
    }
    id.AppendVertexNeighbors(min(max_level, id.level() - 1), cellids);
  }
}